

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWMeshVertexData.h
# Opt level: O1

void __thiscall COLLADAFW::MeshVertexData::~MeshVertexData(MeshVertexData *this)

{
  InputInfosArray *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  InputInfos *pIVar3;
  pointer pcVar4;
  ulong uVar5;
  
  (this->super_FloatOrDoubleArray).super_Animatable._vptr_Animatable =
       (_func_int **)&PTR__MeshVertexData_009e26a0;
  pIVar1 = &this->mInputInfosArray;
  if ((this->mInputInfosArray).mCount != 0) {
    uVar5 = 0;
    do {
      pIVar3 = pIVar1->mData[uVar5];
      if (pIVar3 != (InputInfos *)0x0) {
        pcVar4 = (pIVar3->mName)._M_dataplus._M_p;
        paVar2 = &(pIVar3->mName).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar2) {
          operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
        }
        operator_delete(pIVar3,0x30);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->mInputInfosArray).mCount);
  }
  free((this->mInputInfosArray).mData);
  pIVar1->mData = (InputInfos **)0x0;
  (this->mInputInfosArray).mCount = 0;
  (this->mInputInfosArray).mCapacity = 0;
  if (((this->mInputInfosArray).mFlags & 1) != 0) {
    free(pIVar1->mData);
    pIVar1->mData = (InputInfos **)0x0;
    (this->mInputInfosArray).mCount = 0;
    (this->mInputInfosArray).mCapacity = 0;
  }
  FloatOrDoubleArray::~FloatOrDoubleArray(&this->super_FloatOrDoubleArray);
  return;
}

Assistant:

virtual ~MeshVertexData()
        {
            for ( size_t i=0; i<mInputInfosArray.getCount(); ++i )
            {
                delete mInputInfosArray [i];
            }
            mInputInfosArray.releaseMemory ();
        }